

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O3

bool __thiscall
senjo::StringParam(senjo *this,string *name,string *value,char **params,bool *invalid)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  if ((((name == (string *)0x0) || (pcVar3 = *params, pcVar3 == (char *)0x0)) ||
      (iVar1 = strncmp(pcVar3,(char *)this,(size_t)name), iVar1 != 0)) ||
     ((pcVar3[(long)name] != '\0' && (iVar1 = isspace((int)pcVar3[(long)name]), iVar1 == 0)))) {
    return false;
  }
  *params = pcVar3 + (long)&name->_M_dataplus;
  cVar2 = pcVar3[(long)&name->_M_dataplus];
  if (cVar2 != '\0') {
    pcVar3 = pcVar3 + (long)&name->_M_dataplus;
    do {
      pcVar4 = pcVar3 + 1;
      iVar1 = isspace((int)cVar2);
      if (iVar1 == 0) goto LAB_001381f6;
      *params = pcVar4;
      cVar2 = *pcVar4;
      pcVar3 = pcVar4;
    } while (cVar2 != '\0');
  }
  *invalid = true;
  return true;
  while( true ) {
    *params = pcVar4;
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    if (cVar2 == '\0') break;
LAB_001381f6:
    iVar1 = isspace((int)cVar2);
    if (iVar1 != 0) break;
  }
  std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,(ulong)pcVar3);
  pcVar3 = *params;
  if (pcVar3 != (char *)0x0) {
    cVar2 = *pcVar3;
    while (cVar2 != '\0') {
      pcVar3 = pcVar3 + 1;
      iVar1 = isspace((int)cVar2);
      if (iVar1 == 0) {
        return true;
      }
      *params = pcVar3;
      cVar2 = *pcVar3;
    }
  }
  return true;
}

Assistant:

static inline bool StringParam(const std::string& name, std::string& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params) {
    invalid = true;
  }
  else {
    const char* begin = params;
    NextSpace(params);
    value.assign(begin, (params - begin));
    NextWord(params);
  }
  return true;
}